

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationRootElements::getSecondaryAfter
          (CollationRootElements *this,int32_t index,uint32_t s)

{
  uint32_t local_28;
  uint32_t sec;
  uint32_t secLimit;
  uint32_t secTer;
  uint32_t s_local;
  int32_t index_local;
  CollationRootElements *this_local;
  
  if (index == 0) {
    secTer = this->elements[1];
    sec = this->elements[(int)secTer];
    local_28 = 0x10000;
  }
  else {
    sec = getFirstSecTerForPrimary(this,index + 1);
    local_28 = getSecondaryBoundary(this);
    secTer = index;
  }
  do {
    if (s < sec >> 0x10) {
      return sec >> 0x10;
    }
    secTer = secTer + 1;
    sec = this->elements[(int)secTer];
  } while ((sec & 0x80) != 0);
  return local_28;
}

Assistant:

uint32_t
CollationRootElements::getSecondaryAfter(int32_t index, uint32_t s) const {
    uint32_t secTer;
    uint32_t secLimit;
    if(index == 0) {
        // primary = 0
        U_ASSERT(s != 0);
        index = (int32_t)elements[IX_FIRST_SECONDARY_INDEX];
        secTer = elements[index];
        // Gap at the end of the secondary CE range.
        secLimit = 0x10000;
    } else {
        U_ASSERT(index >= (int32_t)elements[IX_FIRST_PRIMARY_INDEX]);
        secTer = getFirstSecTerForPrimary(index + 1);
        // If this is an explicit sec/ter unit, then it will be read once more.
        // Gap for secondaries of primary CEs.
        secLimit = getSecondaryBoundary();
    }
    for(;;) {
        uint32_t sec = secTer >> 16;
        if(sec > s) { return sec; }
        secTer = elements[++index];
        if((secTer & SEC_TER_DELTA_FLAG) == 0) { return secLimit; }
    }
}